

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcargscontext.cpp
# Opt level: O1

Error __thiscall
asmjit::FuncArgsContext::initWorkData
          (FuncArgsContext *this,FuncFrame *frame,FuncArgsAssignment *args,
          RAConstraints *constraints)

{
  WorkData *this_00;
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  FuncDetail *this_01;
  byte bVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  ulong argIndex;
  FuncValue *pFVar14;
  FuncValue *pFVar15;
  Error EVar16;
  uint uVar17;
  RegInfo *pRVar18;
  uint uVar19;
  Error unaff_EBP;
  WorkData *pWVar20;
  ulong uVar21;
  uint32_t valueIndex;
  ulong valueIndex_00;
  uint32_t *puVar22;
  bool bVar23;
  uint local_7c;
  
  bVar2 = frame->_arch;
  this_01 = args->_funcDetail;
  lVar12 = (ulong)(bVar2 & 0x7f) * 0xd4;
  this->_archTraits = (ArchTraits *)(_archTraits + lVar12);
  this->_constraints = constraints;
  this->_arch = bVar2;
  for (lVar13 = 7; lVar13 != 0x47; lVar13 = lVar13 + 0x10) {
    *(uint32_t *)(this->_workData[0]._reserved + lVar13 * 4 + -0x36) =
         constraints->_availableRegs[0];
    constraints = (RAConstraints *)((long)constraints + 4);
  }
  if ((frame->_attributes & 0x10) != 0) {
    this->_workData[0]._archRegs =
         this->_workData[0]._archRegs &
         (-2 << (_archTraits[lVar12 + 1] & 0x1f) |
         0xfffffffeU >> 0x20 - (_archTraits[lVar12 + 1] & 0x1f));
  }
  this_00 = this->_workData;
  local_7c = 0;
  uVar21 = 0;
  do {
    argIndex = uVar21;
    if (argIndex == 0x10) break;
    for (valueIndex_00 = 0; valueIndex_00 != 4; valueIndex_00 = valueIndex_00 + 1) {
      pFVar14 = FuncArgsAssignment::arg(args,argIndex,valueIndex_00);
      if ((pFVar14->_data & 0x300) == 0) {
        iVar8 = 0xc;
      }
      else {
        pFVar15 = FuncDetail::arg(this_01,argIndex,valueIndex_00);
        uVar11 = pFVar15->_data;
        if ((uVar11 & 0x300) == 0) {
          EVar16 = 3;
        }
        else {
          uVar21 = (ulong)local_7c;
          this->_vars[uVar21].cur._data = uVar11;
          uVar19 = pFVar14->_data;
          this->_vars[uVar21].out._data = uVar19;
          if ((uVar11 >> 10 & 1) == 0) {
            if ((uVar19 >> 8 & 1) == 0) {
              if ((char)uVar19 == '\0') {
                this->_vars[uVar21].out._data = uVar11 & 0xff | uVar19;
              }
              bVar3 = (byte)this->_vars[uVar21].out._data;
              bVar4 = (byte)this->_vars[uVar21].cur._data;
              bVar5 = Type::_typeData[(ulong)bVar4 + 0x100];
              if ((byte)Type::_typeData[(ulong)bVar4 + 0x100] <
                  (byte)Type::_typeData[(ulong)bVar3 + 0x100]) {
                bVar5 = Type::_typeData[(ulong)bVar3 + 0x100];
              }
              if (((byte)(((bVar2 & 1) == 0) * '\x04' + 4U) < bVar5) &&
                 ((9 < bVar3 - 0x20 || (9 < bVar4 - 0x20)))) {
                if ((((8 < bVar5) ||
                     (uVar9 = *(uint32_t *)(_archTraits + lVar12 + 0x3c), uVar9 == 0)) &&
                    ((0x10 < bVar5 ||
                     (uVar9 = *(uint32_t *)(_archTraits + lVar12 + 0x40), uVar9 == 0)))) &&
                   (((0x20 < bVar5 ||
                     (uVar9 = *(uint32_t *)(_archTraits + lVar12 + 0x44), uVar9 == 0)) &&
                    (uVar9 = 0, pRVar18 = (RegInfo *)(_archTraits + lVar12 + 0x48), bVar5 < 0x41))))
                goto LAB_0010c5a8;
              }
              else {
                pRVar18 = ((ArchTraits *)(_archTraits + lVar12))->_regInfo + (ulong)(4 < bVar5) + 5;
LAB_0010c5a8:
                uVar9 = pRVar18->_signature;
              }
              EVar16 = 3;
              if (uVar9 == 0) goto LAB_0010c5f1;
              this->_stackDstMask = this->_stackDstMask | (byte)(1 << ((byte)(uVar9 >> 8) & 0xf));
              uVar11 = 0xff;
              pWVar20 = (WorkData *)0x0;
              uVar9 = 0xffffffff;
            }
            else {
              uVar11 = 0xff;
              if (uVar19 < 0x20000000) {
                uVar17 = uVar19 >> 0x18;
                if (this->_archTraits->_regInfo[uVar17]._signature == 0) goto LAB_0010c6ad;
                if ((char)uVar19 == '\0') {
                  uVar9 = ArchTraits::regTypeToTypeId(this->_archTraits,uVar17);
                  this->_vars[uVar21].out._data = this->_vars[uVar21].out._data & 0xffffff00 | uVar9
                  ;
                }
                uVar9 = ArchTraits::regTypeToGroup(this->_archTraits,uVar17);
                if (uVar9 < 4) {
                  pWVar20 = this_00 + uVar9;
                  bVar3 = *(byte *)((long)&this->_vars[uVar21].out._data + 2);
                  uVar11 = (uint)bVar3;
                  if (bVar3 < 0x20) {
                    uVar19 = 1 << (bVar3 & 0x1f);
                    if ((pWVar20->_archRegs >> (bVar3 & 0x1f) & 1) != 0) {
                      if ((pWVar20->_dstRegs & uVar19) == 0) {
                        pWVar20->_dstRegs = pWVar20->_dstRegs | uVar19;
                        pWVar20->_dstShuf = pWVar20->_dstShuf | uVar19;
                        pWVar20->_usedRegs = pWVar20->_usedRegs | uVar19;
                        cVar6 = '\x01';
                      }
                      else {
                        cVar6 = (char)(0 << (bVar3 & 0x1f));
                        unaff_EBP = 0x41;
                      }
                      goto LAB_0010c6bc;
                    }
                  }
                  cVar6 = '\0';
                  unaff_EBP = 0x1e;
                }
                else {
                  pWVar20 = (WorkData *)0x0;
                  cVar6 = '\0';
                  unaff_EBP = 0x1d;
                  uVar11 = 0xff;
                }
              }
              else {
LAB_0010c6ad:
                pWVar20 = (WorkData *)0x0;
                uVar9 = 0xffffffff;
                cVar6 = '\0';
                unaff_EBP = 0x1c;
              }
LAB_0010c6bc:
              if (cVar6 == '\0') {
                iVar8 = 1;
                goto LAB_0010c7e0;
              }
            }
            uVar19 = this->_vars[uVar21].cur._data;
            if ((uVar19 >> 8 & 1) == 0) {
              if (pWVar20 != (WorkData *)0x0) {
                pWVar20->_numStackArgs = pWVar20->_numStackArgs + '\x01';
              }
              this->_hasStackSrc = true;
            }
            else {
              uVar17 = uVar19 >> 0x10 & 0xff;
              uVar10 = ArchTraits::regTypeToGroup(this->_archTraits,uVar19 >> 0x18);
              if (uVar9 == uVar10) {
                WorkData::assign(pWVar20,local_7c,uVar17);
                bVar23 = true;
                if (uVar11 == uVar17) {
                  pbVar1 = (byte *)((long)&this->_vars[uVar21].cur._data + 1);
                  *pbVar1 = *pbVar1 | 8;
                }
              }
              else {
                if (3 < uVar10) {
                  unaff_EBP = 3;
                }
                else {
                  WorkData::assign(this_00 + uVar10,local_7c,uVar17);
                }
                bVar23 = 3 >= uVar10;
              }
              if (!bVar23) {
                iVar8 = 1;
                goto LAB_0010c7e0;
              }
            }
            local_7c = local_7c + 1;
            iVar8 = 0;
            goto LAB_0010c7e0;
          }
          EVar16 = 0x1a;
        }
LAB_0010c5f1:
        iVar8 = 1;
        unaff_EBP = EVar16;
      }
LAB_0010c7e0:
      if ((iVar8 != 0xc) && (iVar8 != 0)) break;
    }
    uVar21 = argIndex + 1;
  } while (3 < valueIndex_00);
  if (argIndex < 0x10) {
    return unaff_EBP;
  }
  puVar22 = &this->_workData[0]._dstRegs;
  for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
    uVar11 = ((WorkData *)(puVar22 + -4))->_archRegs;
    uVar9 = FuncFrame::dirtyRegs(frame,(uint32_t)lVar13);
    uVar10 = FuncFrame::preservedRegs(frame,(uint32_t)lVar13);
    puVar22[-3] = (~uVar10 | uVar9) & uVar11 | *puVar22 | puVar22[-1];
    puVar22 = puVar22 + 0x10;
  }
  if ((this->_hasStackSrc == true) && (frame->_minDynamicAlignment <= frame->_finalStackAlignment))
  {
    bVar23 = (frame->_attributes & 0x10) == 0;
  }
  else {
    bVar23 = false;
  }
  bVar3 = frame->_saRegId;
  bVar4 = args->_saRegId;
  if ((bVar3 != 0xff) && (bVar7 = WorkData::isAssigned(this_00,(uint)bVar3), bVar7)) {
    return 0x41;
  }
  if (bVar4 == 0xff) {
    if (!bVar23) goto LAB_0010ca33;
  }
  else if ((this->_workData[0]._dstRegs >> (bVar4 & 0x1f) & 1) != 0) {
    return 0x41;
  }
  bVar23 = (bVar2 & 1) == 0;
  this->_saVarId = (uint8_t)local_7c;
  this->_hasPreservedFP = (bool)((byte)frame->_attributes >> 4 & 1);
  uVar21 = (ulong)local_7c;
  this->_vars[uVar21].cur = 0;
  this->_vars[uVar21].out = 0;
  uVar19 = (uint)bVar4;
  uVar11 = (uint)bVar3;
  if ((bVar3 == 0xff) &&
     ((bVar4 == 0xff || (bVar7 = WorkData::isAssigned(this_00,uVar19), uVar11 = uVar19, bVar7)))) {
    uVar11 = this->_workData[0]._workRegs;
    uVar17 = ~this->_workData[0]._assignedRegs & uVar11;
    uVar11 = ~uVar11 & this->_workData[0]._archRegs;
    if (uVar17 != 0) {
      uVar11 = uVar17;
    }
    uVar9 = 0;
    bVar7 = uVar11 != 0;
    if (bVar7) {
      for (; (uVar11 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
      }
    }
    uVar11 = 0xff;
    if (bVar7) {
      uVar11 = uVar9;
    }
    if (bVar7) goto LAB_0010c991;
    bVar23 = false;
    unaff_EBP = 0x40;
  }
  else {
LAB_0010c991:
    uVar17 = 0x5000127;
    if ((bVar2 & 1) == 0) {
      uVar17 = 0x6000129;
    }
    this->_vars[uVar21].cur._data = uVar17 | uVar11 << 0x10;
    WorkData::assign(this_00,local_7c,uVar11);
    uVar11 = this->_workData[0]._workRegs | 1 << (uVar11 & 0x1f);
    this->_workData[0]._workRegs = uVar11;
    if (bVar4 == 0xff) {
      pbVar1 = (byte *)((long)&this->_vars[uVar21].cur._data + 1);
      *pbVar1 = *pbVar1 | 8;
    }
    else {
      this->_vars[uVar21].out._data =
           (uint)bVar23 * 2 + (uVar19 << 0x10 | (uint)bVar23 * 0x1000000 + 0x5000000) + 0x127;
      puVar22 = &this->_workData[0]._dstRegs;
      *puVar22 = *puVar22 | 1 << (bVar4 & 0x1f);
      this->_workData[0]._workRegs = uVar11 | 1 << (uVar19 & 0x1f);
    }
    local_7c = local_7c + 1;
    bVar23 = true;
  }
  if (!bVar23) {
    return unaff_EBP;
  }
LAB_0010ca33:
  this->_varCount = local_7c;
  for (uVar21 = 0; uVar21 < this->_varCount; uVar21 = uVar21 + 1) {
    uVar11 = this->_vars[uVar21].cur._data;
    if (((uVar11 >> 8 & 1) != 0) && (uVar19 = this->_vars[uVar21].out._data, (uVar19 >> 8 & 1) != 0)
       ) {
      uVar9 = ArchTraits::regTypeToGroup(this->_archTraits,uVar11 >> 0x18);
      uVar10 = ArchTraits::regTypeToGroup
                         (this->_archTraits,
                          (uint)*(byte *)((long)&this->_vars[uVar21].out._data + 3));
      if (uVar9 == uVar10) {
        uVar19 = uVar19 >> 0x10 & 0xff;
        pWVar20 = this_00 + uVar9;
        bVar23 = WorkData::isAssigned(pWVar20,uVar19);
        if (bVar23) {
          bVar2 = pWVar20->_physToVarId[uVar19];
          uVar10 = ArchTraits::regTypeToGroup
                             (this->_archTraits,
                              (uint)*(byte *)((long)&this->_vars[bVar2].out._data + 3));
          if ((uVar10 == uVar9) && (((uVar11 ^ this->_vars[bVar2].out._data) & 0xff0000) == 0)) {
            pWVar20->_numSwaps = pWVar20->_numSwaps + '\x01';
            this->_regSwapsMask = this->_regSwapsMask | (byte)(1 << ((byte)uVar9 & 0x1f));
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FuncArgsContext::initWorkData(const FuncFrame& frame, const FuncArgsAssignment& args, const RAConstraints* constraints) noexcept {
  // The code has to be updated if this changes.
  ASMJIT_ASSERT(BaseReg::kGroupVirt == 4);

  uint32_t i;

  uint32_t arch = frame.arch();
  const FuncDetail& func = *args.funcDetail();

  _archTraits = &ArchTraits::byArch(arch);
  _constraints = constraints;
  _arch = uint8_t(arch);

  // Initialize `_archRegs`.
  for (i = 0; i < BaseReg::kGroupVirt; i++)
    _workData[i]._archRegs = _constraints->availableRegs(i);

  if (frame.hasPreservedFP())
    _workData[BaseReg::kGroupGp]._archRegs &= ~Support::bitMask(archTraits().fpRegId());

  // Extract information from all function arguments/assignments and build Var[] array.
  uint32_t varId = 0;
  for (uint32_t argIndex = 0; argIndex < Globals::kMaxFuncArgs; argIndex++) {
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      const FuncValue& dst_ = args.arg(argIndex, valueIndex);
      if (!dst_.isAssigned())
        continue;

      const FuncValue& src_ = func.arg(argIndex, valueIndex);
      if (ASMJIT_UNLIKELY(!src_.isAssigned()))
        return DebugUtils::errored(kErrorInvalidState);

      Var& var = _vars[varId];
      var.init(src_, dst_);

      FuncValue& src = var.cur;
      FuncValue& dst = var.out;

      uint32_t dstGroup = 0xFFFFFFFFu;
      uint32_t dstId = BaseReg::kIdBad;
      WorkData* dstWd = nullptr;

      // Not supported.
      if (src.isIndirect())
        return DebugUtils::errored(kErrorInvalidAssignment);

      if (dst.isReg()) {
        uint32_t dstType = dst.regType();
        if (ASMJIT_UNLIKELY(!archTraits().hasRegType(dstType)))
          return DebugUtils::errored(kErrorInvalidRegType);

        // Copy TypeId from source if the destination doesn't have it. The RA
        // used by BaseCompiler would never leave TypeId undefined, but users
        // of FuncAPI can just assign phys regs without specifying the type.
        if (!dst.hasTypeId())
          dst.setTypeId(archTraits().regTypeToTypeId(dst.regType()));

        dstGroup = archTraits().regTypeToGroup(dstType);
        if (ASMJIT_UNLIKELY(dstGroup >= BaseReg::kGroupVirt))
          return DebugUtils::errored(kErrorInvalidRegGroup);

        dstWd = &_workData[dstGroup];
        dstId = dst.regId();
        if (ASMJIT_UNLIKELY(dstId >= 32 || !Support::bitTest(dstWd->archRegs(), dstId)))
          return DebugUtils::errored(kErrorInvalidPhysId);

        if (ASMJIT_UNLIKELY(Support::bitTest(dstWd->dstRegs(), dstId)))
          return DebugUtils::errored(kErrorOverlappedRegs);

        dstWd->_dstRegs  |= Support::bitMask(dstId);
        dstWd->_dstShuf  |= Support::bitMask(dstId);
        dstWd->_usedRegs |= Support::bitMask(dstId);
      }
      else {
        if (!dst.hasTypeId())
          dst.setTypeId(src.typeId());

        RegInfo regInfo = getSuitableRegForMemToMemMove(arch, dst.typeId(), src.typeId());
        if (ASMJIT_UNLIKELY(!regInfo.isValid()))
          return DebugUtils::errored(kErrorInvalidState);
        _stackDstMask = uint8_t(_stackDstMask | Support::bitMask(regInfo.group()));
      }

      if (src.isReg()) {
        uint32_t srcId = src.regId();
        uint32_t srcGroup = archTraits().regTypeToGroup(src.regType());

        if (dstGroup == srcGroup) {
          dstWd->assign(varId, srcId);

          // The best case, register is allocated where it is expected to be.
          if (dstId == srcId)
            var.markDone();
        }
        else {
          if (ASMJIT_UNLIKELY(srcGroup >= BaseReg::kGroupVirt))
            return DebugUtils::errored(kErrorInvalidState);

          WorkData& srcData = _workData[srcGroup];
          srcData.assign(varId, srcId);
        }
      }
      else {
        if (dstWd)
          dstWd->_numStackArgs++;
        _hasStackSrc = true;
      }

      varId++;
    }
  }

  // Initialize WorkData::workRegs.
  for (i = 0; i < BaseReg::kGroupVirt; i++) {
    _workData[i]._workRegs = (_workData[i].archRegs() & (frame.dirtyRegs(i) | ~frame.preservedRegs(i))) | _workData[i].dstRegs() | _workData[i].assignedRegs();
  }

  // Create a variable that represents `SARegId` if necessary.
  bool saRegRequired = _hasStackSrc && frame.hasDynamicAlignment() && !frame.hasPreservedFP();

  WorkData& gpRegs = _workData[BaseReg::kGroupGp];
  uint32_t saCurRegId = frame.saRegId();
  uint32_t saOutRegId = args.saRegId();

  if (saCurRegId != BaseReg::kIdBad) {
    // Check if the provided `SARegId` doesn't collide with input registers.
    if (ASMJIT_UNLIKELY(gpRegs.isAssigned(saCurRegId)))
      return DebugUtils::errored(kErrorOverlappedRegs);
  }

  if (saOutRegId != BaseReg::kIdBad) {
    // Check if the provided `SARegId` doesn't collide with argument assignments.
    if (ASMJIT_UNLIKELY(Support::bitTest(gpRegs.dstRegs(), saOutRegId)))
      return DebugUtils::errored(kErrorOverlappedRegs);
    saRegRequired = true;
  }

  if (saRegRequired) {
    uint32_t ptrTypeId = Environment::is32Bit(arch) ? Type::kIdU32 : Type::kIdU64;
    uint32_t ptrRegType = Environment::is32Bit(arch) ? BaseReg::kTypeGp32 : BaseReg::kTypeGp64;

    _saVarId = uint8_t(varId);
    _hasPreservedFP = frame.hasPreservedFP();

    Var& var = _vars[varId];
    var.reset();

    if (saCurRegId == BaseReg::kIdBad) {
      if (saOutRegId != BaseReg::kIdBad && !gpRegs.isAssigned(saOutRegId)) {
        saCurRegId = saOutRegId;
      }
      else {
        uint32_t availableRegs = gpRegs.availableRegs();
        if (!availableRegs)
          availableRegs = gpRegs.archRegs() & ~gpRegs.workRegs();

        if (ASMJIT_UNLIKELY(!availableRegs))
          return DebugUtils::errored(kErrorNoMorePhysRegs);

        saCurRegId = Support::ctz(availableRegs);
      }
    }

    var.cur.initReg(ptrRegType, saCurRegId, ptrTypeId);
    gpRegs.assign(varId, saCurRegId);
    gpRegs._workRegs |= Support::bitMask(saCurRegId);

    if (saOutRegId != BaseReg::kIdBad) {
      var.out.initReg(ptrRegType, saOutRegId, ptrTypeId);
      gpRegs._dstRegs  |= Support::bitMask(saOutRegId);
      gpRegs._workRegs |= Support::bitMask(saOutRegId);
    }
    else {
      var.markDone();
    }

    varId++;
  }

  _varCount = varId;

  // Detect register swaps.
  for (varId = 0; varId < _varCount; varId++) {
    Var& var = _vars[varId];
    if (var.cur.isReg() && var.out.isReg()) {
      uint32_t srcId = var.cur.regId();
      uint32_t dstId = var.out.regId();

      uint32_t group = archTraits().regTypeToGroup(var.cur.regType());
      if (group != archTraits().regTypeToGroup(var.out.regType()))
        continue;

      WorkData& wd = _workData[group];
      if (wd.isAssigned(dstId)) {
        Var& other = _vars[wd._physToVarId[dstId]];
        if (archTraits().regTypeToGroup(other.out.regType()) == group && other.out.regId() == srcId) {
          wd._numSwaps++;
          _regSwapsMask = uint8_t(_regSwapsMask | Support::bitMask(group));
        }
      }
    }
  }

  return kErrorOk;
}